

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Routines_Disasm.c
# Opt level: O3

int AnalyzeOpcode(PDISASM pMyDisasm)

{
  byte *pbVar1;
  byte *pbVar2;
  
  pbVar1 = (byte *)(pMyDisasm->Reserved_).EIP_;
  pbVar2 = (byte *)(pMyDisasm->Reserved_).EndOfBlock;
  if (pbVar2 < pbVar1 + 1 && pbVar2 != (byte *)0x0) {
    (pMyDisasm->Reserved_).OutOfBlock = 1;
    (pMyDisasm->Reserved_).ERROR_OPCODE = -2;
    return 0;
  }
  (pMyDisasm->Instruction).Opcode = (uint)*pbVar1;
  (*opcode_map1[*pbVar1])(pMyDisasm);
  return 1;
}

Assistant:

int __bea_callspec__ AnalyzeOpcode (PDISASM pMyDisasm)
{
  UInt8 *opcode;
  if (!Security(1, pMyDisasm)) return 0;
  opcode = (UInt8*) GV.EIP_;
  pMyDisasm->Instruction.Opcode = *opcode;
  (void) opcode_map1[*opcode](pMyDisasm);
  return 1;
}